

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O1

void __thiscall
cmCTestMemCheckHandler::PostProcessTest
          (cmCTestMemCheckHandler *this,cmCTestTestResult *res,int test)

{
  cmCTest *this_00;
  string *psVar1;
  ostream *poVar2;
  string *f;
  undefined1 ofile [8];
  ostringstream cmCTestLog_msg;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [8];
  string *psStack_1a0;
  pointer local_198;
  ios_base local_138 [272];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"PostProcessTest memcheck results for : ",0x27);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(res->Name)._M_dataplus._M_p,(res->Name)._M_string_length
                     );
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  this_00 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_00,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
               ,0x4f7,(char *)local_1c8,
               (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.Quiet);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (this->MemoryTesterStyle == 3) {
    PostProcessDrMemoryTest(this,res,test);
  }
  else if (this->MemoryTesterStyle == 4) {
    PostProcessBoundsCheckerTest(this,res,test);
  }
  else {
    local_1a8 = (undefined1  [8])0x0;
    psStack_1a0 = (string *)0x0;
    local_198 = (pointer)0x0;
    TestOutputFileNames(this,test,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_1a8);
    psVar1 = psStack_1a0;
    for (ofile = local_1a8; ofile != (undefined1  [8])psVar1;
        ofile = (undefined1  [8])((long)ofile + 0x20)) {
      AppendMemTesterOutput(this,res,(string *)ofile);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1a8);
  }
  return;
}

Assistant:

void cmCTestMemCheckHandler::PostProcessTest(cmCTestTestResult& res, int test)
{
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "PostProcessTest memcheck results for : " << res.Name
                                                               << std::endl,
                     this->Quiet);
  if (this->MemoryTesterStyle == cmCTestMemCheckHandler::BOUNDS_CHECKER) {
    this->PostProcessBoundsCheckerTest(res, test);
  } else if (this->MemoryTesterStyle == cmCTestMemCheckHandler::DRMEMORY) {
    this->PostProcessDrMemoryTest(res, test);
  } else {
    std::vector<std::string> files;
    this->TestOutputFileNames(test, files);
    for (std::string const& f : files) {
      this->AppendMemTesterOutput(res, f);
    }
  }
}